

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::SetImpl
          (MicroString *this,string_view data,Arena *arena,size_t inline_capacity)

{
  LargeRepKind LVar1;
  LargeRep *pLVar2;
  StringRep *pSVar3;
  size_type sVar4;
  MicroRep *pMVar5;
  char *__dest;
  char *__src;
  size_t __n;
  
  __src = data._M_str;
  __n = data._M_len;
  if (((ulong)this->rep_ & 2) == 0) {
    if (((ulong)this->rep_ & 1) == 0) goto LAB_00260243;
    LVar1 = large_rep_kind(this);
    if (LVar1 == kString) {
      pSVar3 = string_rep(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(pSVar3->str)._M_dataplus._M_p == &(pSVar3->str).field_2) {
        sVar4 = 0xf;
      }
      else {
        sVar4 = (pSVar3->str).field_2._M_allocated_capacity;
      }
      if (__n <= sVar4) {
        std::__cxx11::string::assign((char *)&pSVar3->str,(ulong)__src);
        sVar4 = (pSVar3->str)._M_string_length;
        (pSVar3->super_LargeRep).payload = (pSVar3->str)._M_dataplus._M_p;
        (pSVar3->super_LargeRep).size = (uint32_t)sVar4;
        return;
      }
    }
    else if (LVar1 == kOwned) {
      pLVar2 = large_rep(this);
      if (__n == 0) {
        __n = 0;
LAB_002602ee:
        LargeRep::ChangeSize(pLVar2,__n);
        return;
      }
      if (__n <= pLVar2->capacity) {
        LargeRep::owned_head(pLVar2);
        memmove(pLVar2->payload,__src,__n);
        goto LAB_002602ee;
      }
    }
  }
  else {
    pMVar5 = micro_rep(this);
    if (__n == 0) {
      pMVar5->size = '\0';
      return;
    }
    if (__n <= pMVar5->capacity) {
      memmove(pMVar5 + 1,__src,__n);
      pMVar5->size = (uint8_t)data._M_len;
      return;
    }
  }
  if (arena == (Arena *)0x0) {
    DestroySlow(this);
  }
LAB_00260243:
  if (inline_capacity < __n) {
    if (__n < 0x100) {
      pMVar5 = AllocateMicroRep(this,__n,arena);
      pMVar5 = pMVar5 + 1;
    }
    else {
      pLVar2 = AllocateOwnedRep(this,__n,arena);
      pMVar5 = (MicroRep *)pLVar2->payload;
    }
    memcpy(pMVar5,__src,__n);
    return;
  }
  set_inline_size(this,__n);
  if (__n == 0) {
    return;
  }
  __dest = inline_head(this);
  memmove(__dest,__src,__n);
  return;
}

Assistant:

void MicroString::SetImpl(absl::string_view data, Arena* arena,
                          size_t inline_capacity) {
  // Reuse space if possible.
  if (is_micro_rep()) {
    auto* h = micro_rep();
    if (data.empty()) {
      h->ChangeSize(0);
      return;
    } else if (h->capacity >= data.size()) {
      // We unpoison the buffer first, memmove, then repoison to the new size.
      // We can't poison to the new size first because the input data might be
      // aliasing the previously allowed part of `this`.
      h->Unpoison();
      memmove(h->data(), data.data(), data.size());
      h->ChangeSize(data.size());
      return;
    }
    if (arena == nullptr) {
      DestroySlow();
    }
  } else if (is_large_rep()) {
    switch (large_rep_kind()) {
      case kOwned: {
        auto* h = large_rep();
        if (data.empty()) {
          h->ChangeSize(0);
          return;
        } else if (h->capacity >= data.size()) {
          h->Unpoison();
          memmove(h->payload, data.data(), data.size());
          h->ChangeSize(data.size());
          return;
        }
        break;
      }
      case kString: {
        auto* h = string_rep();
        if (h->str.capacity() >= data.size()) {
          h->str.assign(data.data(), data.size());
          h->ResetBase();
          return;
        }
        break;
      }
      case kAlias:
      case kUnowned:
        // No capacity to reuse.
        break;
    }
    if (arena == nullptr) {
      DestroySlow();
    }
  }

  // If we fit in the inline space, use it.
  if (data.size() <= inline_capacity) {
    set_inline_size(data.size());
    if (!data.empty()) {
      memmove(inline_head(), data.data(), data.size());
    }
    return;
  }

  // Try MicroString rep first.
  if (data.size() <= kMaxMicroRepCapacity) {
    MicroRep* h = AllocateMicroRep(data.size(), arena);
    memcpy(h->data(), data.data(), data.size());
    return;
  }

  // Input is too big for MicroString, use the large large_rep representation.
  LargeRep* h = AllocateOwnedRep(data.size(), arena);
  memcpy(h->payload, data.data(), data.size());
}